

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fUniformApiTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles2::Functional::UniformCase::getUniforms
          (UniformCase *this,
          vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
          *valuesDst,
          vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
          *basicUniforms,deUint32 programGL)

{
  CallLogWrapper *this_00;
  pointer str;
  TestLog *pTVar1;
  pointer pBVar2;
  bool bVar3;
  GLint location;
  uint uVar4;
  deUint32 err;
  GLenum GVar5;
  ulong uVar6;
  int line;
  VarValue *value_00;
  long lVar7;
  char *msg;
  VarValue value;
  string queryName;
  GLint unit;
  undefined1 local_248 [4];
  GLfloat aGStack_244 [19];
  vector<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
  *local_1f8;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [8];
  ostream local_1a8;
  
  pTVar1 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &this->super_CallLogWrapper;
  bVar3 = true;
  lVar7 = 0;
  local_1f8 = basicUniforms;
  do {
    pBVar2 = (local_1f8->
             super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(local_1f8->
                     super__Vector_base<deqp::gles2::Functional::UniformCase::BasicUniform,_std::allocator<deqp::gles2::Functional::UniformCase::BasicUniform>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pBVar2) / 0x98) <= lVar7) {
      return bVar3;
    }
    str = pBVar2 + lVar7;
    if ((((this->super_CallLogWrapper).field_0x14 & 0x80) == 0) || (pBVar2[lVar7].elemNdx != 0)) {
      std::__cxx11::string::string((string *)&local_1f0,(string *)str);
    }
    else {
      beforeLast(&local_1f0,&str->name,(char)this);
    }
    location = glu::CallLogWrapper::glGetUniformLocation
                         (this_00,programGL,local_1f0._M_dataplus._M_p);
    uVar4 = glu::getDataTypeScalarSize(str->type);
    aGStack_244[0xb] = -4.3160208e+08;
    aGStack_244[0xc] = -4.3160208e+08;
    aGStack_244[0xd] = -4.3160208e+08;
    aGStack_244[0xe] = -4.3160208e+08;
    aGStack_244[7] = -4.3160208e+08;
    aGStack_244[8] = -4.3160208e+08;
    aGStack_244[9] = -4.3160208e+08;
    aGStack_244[10] = -4.3160208e+08;
    aGStack_244[3] = -4.3160208e+08;
    aGStack_244[4] = -4.3160208e+08;
    aGStack_244[5] = -4.3160208e+08;
    aGStack_244[6] = -4.3160208e+08;
    aGStack_244[1] = -4.3160208e+08;
    aGStack_244[2] = -4.3160208e+08;
    aGStack_244[0xf] = -4.3160208e+08;
    if (location == -1) {
      _local_248 = 0xcdcdcdcd00000000;
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ::push_back(valuesDst,(value_type *)local_248);
      if (str->isUsedInShader == true) {
        local_1b0 = (undefined1  [8])pTVar1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::operator<<(&local_1a8,"// FAILURE: ");
        std::operator<<(&local_1a8,(string *)str);
        std::operator<<(&local_1a8," was used in shader, but has location -1");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        bVar3 = false;
      }
    }
    else {
      local_248 = (undefined1  [4])str->type;
      aGStack_244[0] = -4.3160208e+08;
      if (((int)local_248 - TYPE_FLOAT < 4) ||
         ((int)local_248 - TYPE_FLOAT_MAT2 < 9 || (int)local_248 - TYPE_DOUBLE_MAT2 < 9)) {
        glu::CallLogWrapper::glGetUniformfv(this_00,programGL,location,(GLfloat *)(local_248 + 4));
        err = glu::CallLogWrapper::glGetError(this_00);
        line = 0x56e;
        msg = "glGetUniformfv(programGL, location, &value.val.floatV[0])";
LAB_00ed08c5:
        glu::checkError(err,msg,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                        ,line);
      }
      else {
        if ((int)local_248 - TYPE_INT < 4) {
          glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)(local_248 + 4));
          err = glu::CallLogWrapper::glGetError(this_00);
          line = 0x570;
          msg = "glGetUniformiv(programGL, location, &value.val.intV[0])";
          goto LAB_00ed08c5;
        }
        if ((int)local_248 - TYPE_BOOL < 4) {
          if (((this->super_CallLogWrapper).field_0x14 & 0x20) == 0) {
            glu::CallLogWrapper::glGetUniformfv
                      (this_00,programGL,location,(GLfloat *)(local_248 + 4));
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,"glGetUniformfv(programGL, location, &value.val.floatV[0])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,0x57b);
            if ((int)uVar4 < 1) {
              uVar4 = 0;
            }
            for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
              local_248[uVar6 + 4] = *(float *)(local_248 + uVar6 * 4 + 4) != 0.0;
            }
          }
          else {
            glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)(local_248 + 4))
            ;
            GVar5 = glu::CallLogWrapper::glGetError(this_00);
            glu::checkError(GVar5,"glGetUniformiv(programGL, location, &value.val.intV[0])",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                            ,0x575);
            if ((int)uVar4 < 1) {
              uVar4 = 0;
            }
            for (uVar6 = 0; uVar4 != uVar6; uVar6 = uVar6 + 1) {
              local_248[uVar6 + 4] = *(int *)(local_248 + uVar6 * 4 + 4) != 0;
            }
          }
        }
        else if ((int)local_248 - TYPE_SAMPLER_1D < 0x1e) {
          local_1b0._0_4_ = 0xffffffff;
          glu::CallLogWrapper::glGetUniformiv(this_00,programGL,location,(GLint *)local_1b0);
          GVar5 = glu::CallLogWrapper::glGetError(this_00);
          glu::checkError(GVar5,"glGetUniformiv(programGL, location, &unit)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fUniformApiTests.cpp"
                          ,0x583);
          aGStack_244[0] = (GLfloat)local_1b0._0_4_;
        }
      }
      std::
      vector<deqp::gles2::Functional::(anonymous_namespace)::VarValue,_std::allocator<deqp::gles2::Functional::(anonymous_namespace)::VarValue>_>
      ::push_back(valuesDst,(value_type *)local_248);
      local_1b0 = (undefined1  [8])pTVar1;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::operator<<(&local_1a8,"// Got ");
      std::operator<<(&local_1a8,(string *)str);
      std::operator<<(&local_1a8," value ");
      apiVarValueStr_abi_cxx11_(&local_1d0,(Functional *)local_248,value_00);
      std::operator<<(&local_1a8,(string *)&local_1d0);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

bool UniformCase::getUniforms (vector<VarValue>& valuesDst, const vector<BasicUniform>& basicUniforms, const deUint32 programGL)
{
	TestLog&	log			= m_testCtx.getLog();
	bool		success		= true;

	for (int unifNdx = 0; unifNdx < (int)basicUniforms.size(); unifNdx++)
	{
		const BasicUniform&		uniform		= basicUniforms[unifNdx];
		const string			queryName	= m_features & FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX && uniform.elemNdx == 0 ? beforeLast(uniform.name, '[') : uniform.name;
		const int				location	= glGetUniformLocation(programGL, queryName.c_str());
		const int				size		= glu::getDataTypeScalarSize(uniform.type);
		VarValue				value;

		deMemset(&value, 0xcd, sizeof(value)); // Initialize to known garbage.

		if (location == -1)
		{
			value.type = glu::TYPE_INVALID;
			valuesDst.push_back(value);
			if (uniform.isUsedInShader)
			{
				log << TestLog::Message << "// FAILURE: " << uniform.name << " was used in shader, but has location -1" << TestLog::EndMessage;
				success = false;
			}
			continue;
		}

		value.type = uniform.type;

		DE_STATIC_ASSERT(sizeof(GLint) == sizeof(value.val.intV[0]));
		DE_STATIC_ASSERT(sizeof(GLfloat) == sizeof(value.val.floatV[0]));

		if (glu::isDataTypeFloatOrVec(uniform.type) || glu::isDataTypeMatrix(uniform.type))
			GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
		else if (glu::isDataTypeIntOrIVec(uniform.type))
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
		else if (glu::isDataTypeBoolOrBVec(uniform.type))
		{
			if (m_features & FEATURE_BOOLEANAPITYPE_INT)
			{
				GLU_CHECK_CALL(glGetUniformiv(programGL, location, &value.val.intV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.intV[i] != 0;
			}
			else // Default: use float.
			{
				GLU_CHECK_CALL(glGetUniformfv(programGL, location, &value.val.floatV[0]));
				for (int i = 0; i < size; i++)
					value.val.boolV[i] = value.val.floatV[i] != 0.0f;
			}
		}
		else if (glu::isDataTypeSampler(uniform.type))
		{
			GLint unit = -1;
			GLU_CHECK_CALL(glGetUniformiv(programGL, location, &unit));
			value.val.samplerV.unit = unit;
		}
		else
			DE_ASSERT(false);

		valuesDst.push_back(value);

		log << TestLog::Message << "// Got " << uniform.name << " value " << apiVarValueStr(value) << TestLog::EndMessage;
	}

	return success;
}